

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

uint64_t roaring64_iterator_read(roaring64_iterator_t *it,uint64_t *buf,uint64_t count)

{
  art_val_t *paVar1;
  _Bool _Var2;
  roaring_container_iterator_t rVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint16_t low16;
  uint16_t local_3e;
  uint32_t container_consumed;
  art_iterator_t *local_38;
  
  uVar5 = 0;
  if ((count != 0) && (it->has_value != false)) {
    local_38 = &it->art_it;
    uVar5 = 0;
    do {
      paVar1 = (it->art_it).value;
      low16 = (uint16_t)it->value;
      uVar6 = count - uVar5;
      if (0xfffffffe < uVar6) {
        uVar6 = 0xffffffff;
      }
      _Var2 = container_iterator_read_into_uint64
                        (*(container_t **)(paVar1[1].key + 2),paVar1[1].key[0],&it->container_it,
                         it->high48,buf,(uint32_t)uVar6,&container_consumed,&low16);
      uVar6 = (ulong)container_consumed;
      uVar5 = uVar5 + uVar6;
      if (_Var2) {
        it->has_value = true;
        it->value = (ulong)low16 | it->high48;
        return uVar5;
      }
      _Var2 = art_iterator_next(local_38);
      it->has_value = _Var2;
      if (!_Var2) {
        return uVar5;
      }
      buf = buf + uVar6;
      uVar6 = (ulong)*(ushort *)((it->art_it).key + 4) << 0x20;
      uVar4 = (ulong)*(uint6 *)(it->art_it).key;
      it->high48 = (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                   (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28
                   | uVar4 << 0x38;
      paVar1 = (it->art_it).value;
      local_3e = 0;
      rVar3 = container_init_iterator
                        (*(container_t **)(paVar1[1].key + 2),paVar1[1].key[0],&local_3e);
      (it->container_it).index = rVar3.index;
      it->value = (ulong)local_3e | it->high48;
      it->has_value = true;
    } while (uVar5 < count);
  }
  return uVar5;
}

Assistant:

uint64_t roaring64_iterator_read(roaring64_iterator_t *it, uint64_t *buf,
                                 uint64_t count) {
    uint64_t consumed = 0;
    while (it->has_value && consumed < count) {
        uint32_t container_consumed;
        leaf_t *leaf = (leaf_t *)it->art_it.value;
        uint16_t low16 = (uint16_t)it->value;
        uint32_t container_count = UINT32_MAX;
        if (count - consumed < (uint64_t)UINT32_MAX) {
            container_count = count - consumed;
        }
        bool has_value = container_iterator_read_into_uint64(
            leaf->container, leaf->typecode, &it->container_it, it->high48, buf,
            container_count, &container_consumed, &low16);
        consumed += container_consumed;
        buf += container_consumed;
        if (has_value) {
            it->has_value = true;
            it->value = it->high48 | low16;
            assert(consumed == count);
            return consumed;
        }
        it->has_value = art_iterator_next(&it->art_it);
        if (it->has_value) {
            roaring64_iterator_init_at_leaf_first(it);
        }
    }
    return consumed;
}